

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  Scene *pSVar60;
  long lVar61;
  ulong uVar62;
  ulong *puVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar74 [32];
  float fVar80;
  undefined1 auVar75 [32];
  float fVar81;
  float fVar87;
  float fVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  float fVar89;
  float fVar92;
  float fVar94;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar90;
  float fVar91;
  float fVar93;
  undefined1 auVar86 [64];
  float fVar95;
  float fVar100;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  float fVar102;
  undefined1 auVar98 [32];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  float fVar106;
  float fVar107;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar112 [64];
  float fVar125;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  float fVar139;
  float fVar140;
  undefined1 auVar141 [32];
  float fVar145;
  float fVar147;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar142 [32];
  float fVar144;
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 auVar143 [64];
  float fVar156;
  float fVar157;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar171;
  float fVar172;
  undefined1 auVar173 [32];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar174 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_17ec;
  long local_17e8;
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined8 local_17a0;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined4 local_1780;
  float local_177c;
  float local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  uint local_1768;
  uint local_1764;
  uint local_1760;
  RTCFilterFunctionNArguments local_1750;
  undefined8 local_1720;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar63 = local_1200 + 1;
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar4,auVar69);
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar108,1);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar108 = vdivps_avx(auVar109,(undefined1  [16])aVar4);
      auVar110._8_4_ = 0x5d5e0b6b;
      auVar110._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar110._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar108,auVar110,auVar69);
      auVar96._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar96._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar96._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar96._12_4_ = auVar69._12_4_ * 0.99999964;
      auVar82._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar82._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar82._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar82._12_4_ = auVar69._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_14e0._4_4_ = uVar3;
      local_14e0._0_4_ = uVar3;
      local_14e0._8_4_ = uVar3;
      local_14e0._12_4_ = uVar3;
      local_14e0._16_4_ = uVar3;
      local_14e0._20_4_ = uVar3;
      local_14e0._24_4_ = uVar3;
      local_14e0._28_4_ = uVar3;
      auVar138 = ZEXT3264(local_14e0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1500._4_4_ = uVar3;
      local_1500._0_4_ = uVar3;
      local_1500._8_4_ = uVar3;
      local_1500._12_4_ = uVar3;
      local_1500._16_4_ = uVar3;
      local_1500._20_4_ = uVar3;
      local_1500._24_4_ = uVar3;
      local_1500._28_4_ = uVar3;
      auVar143 = ZEXT3264(local_1500);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1520._4_4_ = uVar3;
      local_1520._0_4_ = uVar3;
      local_1520._8_4_ = uVar3;
      local_1520._12_4_ = uVar3;
      local_1520._16_4_ = uVar3;
      local_1520._20_4_ = uVar3;
      local_1520._24_4_ = uVar3;
      local_1520._28_4_ = uVar3;
      auVar159 = ZEXT3264(local_1520);
      auVar69 = vshufps_avx(auVar96,auVar96,0);
      local_1540._16_16_ = auVar69;
      local_1540._0_16_ = auVar69;
      auVar168 = ZEXT3264(local_1540);
      auVar69 = vmovshdup_avx(auVar96);
      auVar108 = vshufps_avx(auVar96,auVar96,0x55);
      local_1560._16_16_ = auVar108;
      local_1560._0_16_ = auVar108;
      auVar170 = ZEXT3264(local_1560);
      auVar108 = vshufpd_avx(auVar96,auVar96,1);
      auVar109 = vshufps_avx(auVar96,auVar96,0xaa);
      local_1580._16_16_ = auVar109;
      local_1580._0_16_ = auVar109;
      auVar174 = ZEXT3264(local_1580);
      auVar109 = vshufps_avx(auVar82,auVar82,0);
      local_15a0._16_16_ = auVar109;
      local_15a0._0_16_ = auVar109;
      auVar188 = ZEXT3264(local_15a0);
      auVar109 = vshufps_avx(auVar82,auVar82,0x55);
      local_15c0._16_16_ = auVar109;
      local_15c0._0_16_ = auVar109;
      auVar99 = ZEXT3264(local_15c0);
      auVar109 = vshufps_avx(auVar82,auVar82,0xaa);
      local_15e0._16_16_ = auVar109;
      local_15e0._0_16_ = auVar109;
      auVar86 = ZEXT3264(local_15e0);
      uVar64 = (ulong)(auVar96._0_4_ < 0.0) << 5;
      uVar65 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x40;
      uVar66 = (ulong)(auVar108._0_4_ < 0.0) << 5 | 0x80;
      uVar67 = uVar64 ^ 0x20;
      uVar68 = uVar65 ^ 0x20;
      auVar69 = vshufps_avx(auVar14,auVar14,0);
      local_1600._16_16_ = auVar69;
      local_1600._0_16_ = auVar69;
      auVar112 = ZEXT3264(local_1600);
      auVar69 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      local_14a0._0_16_ = mm_lookupmask_ps._0_16_;
      local_14a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_1620._16_16_ = auVar69;
      local_1620._0_16_ = auVar69;
      auVar130 = ZEXT3264(local_1620);
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      auVar74._16_4_ = 0x3f800000;
      auVar74._20_4_ = 0x3f800000;
      auVar74._24_4_ = 0x3f800000;
      auVar74._28_4_ = 0x3f800000;
      auVar70._8_4_ = 0xbf800000;
      auVar70._0_8_ = 0xbf800000bf800000;
      auVar70._12_4_ = 0xbf800000;
      auVar70._16_4_ = 0xbf800000;
      auVar70._20_4_ = 0xbf800000;
      auVar70._24_4_ = 0xbf800000;
      auVar70._28_4_ = 0xbf800000;
      _local_14c0 = vblendvps_avx(auVar74,auVar70,local_14a0);
LAB_00e693d5:
      if (puVar63 != local_1200) {
        uVar62 = puVar63[-1];
        puVar63 = puVar63 + -1;
        while ((uVar62 & 8) == 0) {
          auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + uVar64),auVar138._0_32_);
          auVar15._4_4_ = auVar168._4_4_ * auVar70._4_4_;
          auVar15._0_4_ = auVar168._0_4_ * auVar70._0_4_;
          auVar15._8_4_ = auVar168._8_4_ * auVar70._8_4_;
          auVar15._12_4_ = auVar168._12_4_ * auVar70._12_4_;
          auVar15._16_4_ = auVar168._16_4_ * auVar70._16_4_;
          auVar15._20_4_ = auVar168._20_4_ * auVar70._20_4_;
          auVar15._24_4_ = auVar168._24_4_ * auVar70._24_4_;
          auVar15._28_4_ = auVar70._28_4_;
          auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + uVar65),auVar143._0_32_);
          auVar16._4_4_ = auVar170._4_4_ * auVar70._4_4_;
          auVar16._0_4_ = auVar170._0_4_ * auVar70._0_4_;
          auVar16._8_4_ = auVar170._8_4_ * auVar70._8_4_;
          auVar16._12_4_ = auVar170._12_4_ * auVar70._12_4_;
          auVar16._16_4_ = auVar170._16_4_ * auVar70._16_4_;
          auVar16._20_4_ = auVar170._20_4_ * auVar70._20_4_;
          auVar16._24_4_ = auVar170._24_4_ * auVar70._24_4_;
          auVar16._28_4_ = auVar70._28_4_;
          auVar70 = vmaxps_avx(auVar15,auVar16);
          auVar74 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + uVar66),auVar159._0_32_);
          auVar17._4_4_ = auVar174._4_4_ * auVar74._4_4_;
          auVar17._0_4_ = auVar174._0_4_ * auVar74._0_4_;
          auVar17._8_4_ = auVar174._8_4_ * auVar74._8_4_;
          auVar17._12_4_ = auVar174._12_4_ * auVar74._12_4_;
          auVar17._16_4_ = auVar174._16_4_ * auVar74._16_4_;
          auVar17._20_4_ = auVar174._20_4_ * auVar74._20_4_;
          auVar17._24_4_ = auVar174._24_4_ * auVar74._24_4_;
          auVar17._28_4_ = auVar74._28_4_;
          auVar74 = vmaxps_avx(auVar17,auVar112._0_32_);
          auVar70 = vmaxps_avx(auVar70,auVar74);
          auVar74 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + uVar67),auVar138._0_32_);
          auVar18._4_4_ = auVar188._4_4_ * auVar74._4_4_;
          auVar18._0_4_ = auVar188._0_4_ * auVar74._0_4_;
          auVar18._8_4_ = auVar188._8_4_ * auVar74._8_4_;
          auVar18._12_4_ = auVar188._12_4_ * auVar74._12_4_;
          auVar18._16_4_ = auVar188._16_4_ * auVar74._16_4_;
          auVar18._20_4_ = auVar188._20_4_ * auVar74._20_4_;
          auVar18._24_4_ = auVar188._24_4_ * auVar74._24_4_;
          auVar18._28_4_ = auVar74._28_4_;
          auVar74 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + uVar68),auVar143._0_32_);
          auVar19._4_4_ = auVar99._4_4_ * auVar74._4_4_;
          auVar19._0_4_ = auVar99._0_4_ * auVar74._0_4_;
          auVar19._8_4_ = auVar99._8_4_ * auVar74._8_4_;
          auVar19._12_4_ = auVar99._12_4_ * auVar74._12_4_;
          auVar19._16_4_ = auVar99._16_4_ * auVar74._16_4_;
          auVar19._20_4_ = auVar99._20_4_ * auVar74._20_4_;
          auVar19._24_4_ = auVar99._24_4_ * auVar74._24_4_;
          auVar19._28_4_ = auVar74._28_4_;
          auVar74 = vminps_avx(auVar18,auVar19);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar62 + 0x40 + (uVar66 ^ 0x20)),
                               auVar159._0_32_);
          auVar20._4_4_ = auVar86._4_4_ * auVar15._4_4_;
          auVar20._0_4_ = auVar86._0_4_ * auVar15._0_4_;
          auVar20._8_4_ = auVar86._8_4_ * auVar15._8_4_;
          auVar20._12_4_ = auVar86._12_4_ * auVar15._12_4_;
          auVar20._16_4_ = auVar86._16_4_ * auVar15._16_4_;
          auVar20._20_4_ = auVar86._20_4_ * auVar15._20_4_;
          auVar20._24_4_ = auVar86._24_4_ * auVar15._24_4_;
          auVar20._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar20,auVar130._0_32_);
          auVar74 = vminps_avx(auVar74,auVar15);
          auVar70 = vcmpps_avx(auVar70,auVar74,2);
          uVar56 = vmovmskps_avx(auVar70);
          if (uVar56 == 0) goto LAB_00e693d5;
          uVar56 = uVar56 & 0xff;
          uVar57 = uVar62 & 0xfffffffffffffff0;
          lVar61 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
            }
          }
          uVar62 = *(ulong *)(uVar57 + lVar61 * 8);
          uVar56 = uVar56 - 1 & uVar56;
          uVar59 = (ulong)uVar56;
          if (uVar56 != 0) {
            do {
              *puVar63 = uVar62;
              puVar63 = puVar63 + 1;
              lVar61 = 0;
              if (uVar59 != 0) {
                for (; (uVar59 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                }
              }
              uVar62 = *(ulong *)(uVar57 + lVar61 * 8);
              uVar59 = uVar59 - 1 & uVar59;
            } while (uVar59 != 0);
          }
        }
        local_17e8 = (ulong)((uint)uVar62 & 0xf) - 8;
        uVar62 = uVar62 & 0xfffffffffffffff0;
        for (lVar61 = 0; lVar61 != local_17e8; lVar61 = lVar61 + 1) {
          lVar58 = lVar61 * 0xe0;
          lVar1 = uVar62 + 0xd0 + lVar58;
          local_1400 = *(undefined8 *)(lVar1 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar62 + 0xc0 + lVar58;
          local_13e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar71._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x60 + lVar58);
          auVar71._0_16_ = *(undefined1 (*) [16])(uVar62 + lVar58);
          auVar126._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x70 + lVar58);
          auVar126._0_16_ = *(undefined1 (*) [16])(uVar62 + 0x10 + lVar58);
          auVar72._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x80 + lVar58);
          auVar72._0_16_ = *(undefined1 (*) [16])(uVar62 + 0x20 + lVar58);
          auVar69 = *(undefined1 (*) [16])(uVar62 + 0x30 + lVar58);
          auVar97._16_16_ = auVar69;
          auVar97._0_16_ = auVar69;
          auVar69 = *(undefined1 (*) [16])(uVar62 + 0x40 + lVar58);
          auVar111._16_16_ = auVar69;
          auVar111._0_16_ = auVar69;
          auVar69 = *(undefined1 (*) [16])(uVar62 + 0x50 + lVar58);
          auVar83._16_16_ = auVar69;
          auVar83._0_16_ = auVar69;
          auVar69 = *(undefined1 (*) [16])(uVar62 + 0x90 + lVar58);
          auVar141._16_16_ = auVar69;
          auVar141._0_16_ = auVar69;
          auVar108 = *(undefined1 (*) [16])(uVar62 + 0xa0 + lVar58);
          auVar158._16_16_ = auVar108;
          auVar158._0_16_ = auVar108;
          auVar14 = *(undefined1 (*) [16])(uVar62 + 0xb0 + lVar58);
          auVar167._16_16_ = auVar14;
          auVar167._0_16_ = auVar14;
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar169._4_4_ = uVar3;
          auVar169._0_4_ = uVar3;
          auVar169._8_4_ = uVar3;
          auVar169._12_4_ = uVar3;
          auVar169._16_4_ = uVar3;
          auVar169._20_4_ = uVar3;
          auVar169._24_4_ = uVar3;
          auVar169._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar173._4_4_ = uVar3;
          auVar173._0_4_ = uVar3;
          auVar173._8_4_ = uVar3;
          auVar173._12_4_ = uVar3;
          auVar173._16_4_ = uVar3;
          auVar173._20_4_ = uVar3;
          auVar173._24_4_ = uVar3;
          auVar173._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar187._4_4_ = uVar3;
          auVar187._0_4_ = uVar3;
          auVar187._8_4_ = uVar3;
          auVar187._12_4_ = uVar3;
          auVar187._16_4_ = uVar3;
          auVar187._20_4_ = uVar3;
          auVar187._24_4_ = uVar3;
          auVar187._28_4_ = uVar3;
          local_1640 = vsubps_avx(auVar71,auVar169);
          local_1660 = vsubps_avx(auVar126,auVar173);
          local_1680 = vsubps_avx(auVar72,auVar187);
          auVar70 = vsubps_avx(auVar97,auVar169);
          auVar74 = vsubps_avx(auVar111,auVar173);
          auVar15 = vsubps_avx(auVar83,auVar187);
          auVar16 = vsubps_avx(auVar141,auVar169);
          auVar17 = vsubps_avx(auVar158,auVar173);
          auVar18 = vsubps_avx(auVar167,auVar187);
          local_16a0 = vsubps_avx(auVar16,local_1640);
          local_16c0 = vsubps_avx(auVar17,local_1660);
          local_16e0 = vsubps_avx(auVar18,local_1680);
          fVar189 = local_1660._0_4_;
          fVar95 = fVar189 + auVar17._0_4_;
          fVar191 = local_1660._4_4_;
          fVar100 = fVar191 + auVar17._4_4_;
          fVar193 = local_1660._8_4_;
          fVar101 = fVar193 + auVar17._8_4_;
          fVar195 = local_1660._12_4_;
          fVar102 = fVar195 + auVar17._12_4_;
          fVar197 = local_1660._16_4_;
          fVar103 = fVar197 + auVar17._16_4_;
          fVar199 = local_1660._20_4_;
          fVar104 = fVar199 + auVar17._20_4_;
          fVar201 = local_1660._24_4_;
          fVar105 = fVar201 + auVar17._24_4_;
          fVar92 = local_1660._28_4_;
          fVar2 = local_1680._0_4_;
          fVar106 = auVar18._0_4_ + fVar2;
          fVar7 = local_1680._4_4_;
          fVar113 = auVar18._4_4_ + fVar7;
          fVar9 = local_1680._8_4_;
          fVar115 = auVar18._8_4_ + fVar9;
          fVar11 = local_1680._12_4_;
          fVar117 = auVar18._12_4_ + fVar11;
          fVar77 = local_1680._16_4_;
          fVar119 = auVar18._16_4_ + fVar77;
          fVar79 = local_1680._20_4_;
          fVar121 = auVar18._20_4_ + fVar79;
          fVar12 = local_1680._24_4_;
          fVar123 = auVar18._24_4_ + fVar12;
          fVar125 = local_16e0._0_4_;
          fVar131 = local_16e0._4_4_;
          auVar21._4_4_ = fVar131 * fVar100;
          auVar21._0_4_ = fVar125 * fVar95;
          fVar132 = local_16e0._8_4_;
          auVar21._8_4_ = fVar132 * fVar101;
          fVar133 = local_16e0._12_4_;
          auVar21._12_4_ = fVar133 * fVar102;
          fVar134 = local_16e0._16_4_;
          auVar21._16_4_ = fVar134 * fVar103;
          fVar135 = local_16e0._20_4_;
          auVar21._20_4_ = fVar135 * fVar104;
          fVar136 = local_16e0._24_4_;
          auVar21._24_4_ = fVar136 * fVar105;
          auVar21._28_4_ = auVar69._12_4_;
          fVar171 = local_16c0._0_4_;
          fVar175 = local_16c0._4_4_;
          auVar22._4_4_ = fVar175 * fVar113;
          auVar22._0_4_ = fVar171 * fVar106;
          fVar177 = local_16c0._8_4_;
          auVar22._8_4_ = fVar177 * fVar115;
          fVar179 = local_16c0._12_4_;
          auVar22._12_4_ = fVar179 * fVar117;
          fVar181 = local_16c0._16_4_;
          auVar22._16_4_ = fVar181 * fVar119;
          fVar183 = local_16c0._20_4_;
          auVar22._20_4_ = fVar183 * fVar121;
          fVar185 = local_16c0._24_4_;
          auVar22._24_4_ = fVar185 * fVar123;
          auVar22._28_4_ = auVar108._12_4_;
          auVar19 = vsubps_avx(auVar22,auVar21);
          fVar6 = local_1640._0_4_;
          fVar139 = auVar16._0_4_ + fVar6;
          fVar8 = local_1640._4_4_;
          fVar144 = auVar16._4_4_ + fVar8;
          fVar10 = local_1640._8_4_;
          fVar146 = auVar16._8_4_ + fVar10;
          fVar76 = local_1640._12_4_;
          fVar148 = auVar16._12_4_ + fVar76;
          fVar78 = local_1640._16_4_;
          fVar150 = auVar16._16_4_ + fVar78;
          fVar80 = local_1640._20_4_;
          fVar152 = auVar16._20_4_ + fVar80;
          fVar13 = local_1640._24_4_;
          fVar154 = auVar16._24_4_ + fVar13;
          fVar81 = local_16a0._0_4_;
          fVar87 = local_16a0._4_4_;
          auVar23._4_4_ = fVar87 * fVar113;
          auVar23._0_4_ = fVar81 * fVar106;
          fVar88 = local_16a0._8_4_;
          auVar23._8_4_ = fVar88 * fVar115;
          fVar89 = local_16a0._12_4_;
          auVar23._12_4_ = fVar89 * fVar117;
          fVar90 = local_16a0._16_4_;
          auVar23._16_4_ = fVar90 * fVar119;
          fVar91 = local_16a0._20_4_;
          auVar23._20_4_ = fVar91 * fVar121;
          fVar93 = local_16a0._24_4_;
          auVar23._24_4_ = fVar93 * fVar123;
          auVar23._28_4_ = auVar18._28_4_ + local_1680._28_4_;
          auVar22 = local_16e0;
          auVar24._4_4_ = fVar144 * fVar131;
          auVar24._0_4_ = fVar139 * fVar125;
          auVar24._8_4_ = fVar146 * fVar132;
          auVar24._12_4_ = fVar148 * fVar133;
          auVar24._16_4_ = fVar150 * fVar134;
          auVar24._20_4_ = fVar152 * fVar135;
          auVar24._24_4_ = fVar154 * fVar136;
          auVar24._28_4_ = auVar14._12_4_;
          auVar20 = vsubps_avx(auVar24,auVar23);
          auVar25._4_4_ = fVar175 * fVar144;
          auVar25._0_4_ = fVar171 * fVar139;
          auVar25._8_4_ = fVar177 * fVar146;
          auVar25._12_4_ = fVar179 * fVar148;
          auVar25._16_4_ = fVar181 * fVar150;
          auVar25._20_4_ = fVar183 * fVar152;
          auVar25._24_4_ = fVar185 * fVar154;
          auVar25._28_4_ = auVar16._28_4_ + local_1640._28_4_;
          auVar26._4_4_ = fVar87 * fVar100;
          auVar26._0_4_ = fVar81 * fVar95;
          auVar26._8_4_ = fVar88 * fVar101;
          auVar26._12_4_ = fVar89 * fVar102;
          auVar26._16_4_ = fVar90 * fVar103;
          auVar26._20_4_ = fVar91 * fVar104;
          auVar26._24_4_ = fVar93 * fVar105;
          auVar26._28_4_ = fVar92 + auVar17._28_4_;
          auVar21 = vsubps_avx(auVar26,auVar25);
          local_1700._4_4_ = (ray->dir).field_0.m128[1];
          local_1720._4_4_ = (ray->dir).field_0.m128[2];
          local_17a0._4_4_ = (ray->dir).field_0.m128[0];
          local_17c0._0_4_ =
               auVar19._0_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._0_4_ + local_1720._4_4_ * auVar21._0_4_;
          local_17c0._4_4_ =
               auVar19._4_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._4_4_ + local_1720._4_4_ * auVar21._4_4_;
          local_17c0._8_4_ =
               auVar19._8_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._8_4_ + local_1720._4_4_ * auVar21._8_4_;
          local_17c0._12_4_ =
               auVar19._12_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._12_4_ + local_1720._4_4_ * auVar21._12_4_;
          local_17c0._16_4_ =
               auVar19._16_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._16_4_ + local_1720._4_4_ * auVar21._16_4_;
          local_17c0._20_4_ =
               auVar19._20_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._20_4_ + local_1720._4_4_ * auVar21._20_4_;
          local_17c0._24_4_ =
               auVar19._24_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar20._24_4_ + local_1720._4_4_ * auVar21._24_4_;
          local_17c0._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar21._28_4_;
          local_1420 = vsubps_avx(local_1660,auVar74);
          local_1440 = vsubps_avx(local_1680,auVar15);
          fVar100 = fVar189 + auVar74._0_4_;
          fVar101 = fVar191 + auVar74._4_4_;
          fVar102 = fVar193 + auVar74._8_4_;
          fVar103 = fVar195 + auVar74._12_4_;
          fVar104 = fVar197 + auVar74._16_4_;
          fVar105 = fVar199 + auVar74._20_4_;
          fVar106 = fVar201 + auVar74._24_4_;
          fVar113 = fVar2 + auVar15._0_4_;
          fVar115 = fVar7 + auVar15._4_4_;
          fVar117 = fVar9 + auVar15._8_4_;
          fVar119 = fVar11 + auVar15._12_4_;
          fVar121 = fVar77 + auVar15._16_4_;
          fVar123 = fVar79 + auVar15._20_4_;
          fVar139 = fVar12 + auVar15._24_4_;
          fVar95 = auVar15._28_4_;
          fVar172 = local_1440._0_4_;
          fVar176 = local_1440._4_4_;
          auVar27._4_4_ = fVar176 * fVar101;
          auVar27._0_4_ = fVar172 * fVar100;
          fVar178 = local_1440._8_4_;
          auVar27._8_4_ = fVar178 * fVar102;
          fVar180 = local_1440._12_4_;
          auVar27._12_4_ = fVar180 * fVar103;
          fVar182 = local_1440._16_4_;
          auVar27._16_4_ = fVar182 * fVar104;
          fVar184 = local_1440._20_4_;
          auVar27._20_4_ = fVar184 * fVar105;
          fVar186 = local_1440._24_4_;
          auVar27._24_4_ = fVar186 * fVar106;
          auVar27._28_4_ = fVar92;
          fVar156 = local_1420._0_4_;
          fVar160 = local_1420._4_4_;
          auVar28._4_4_ = fVar160 * fVar115;
          auVar28._0_4_ = fVar156 * fVar113;
          fVar162 = local_1420._8_4_;
          auVar28._8_4_ = fVar162 * fVar117;
          fVar163 = local_1420._12_4_;
          auVar28._12_4_ = fVar163 * fVar119;
          fVar164 = local_1420._16_4_;
          auVar28._16_4_ = fVar164 * fVar121;
          fVar165 = local_1420._20_4_;
          auVar28._20_4_ = fVar165 * fVar123;
          fVar166 = local_1420._24_4_;
          auVar28._24_4_ = fVar166 * fVar139;
          auVar28._28_4_ = fVar95;
          auVar19 = vsubps_avx(auVar28,auVar27);
          auVar20 = vsubps_avx(local_1640,auVar70);
          fVar190 = auVar20._0_4_;
          fVar192 = auVar20._4_4_;
          auVar29._4_4_ = fVar192 * fVar115;
          auVar29._0_4_ = fVar190 * fVar113;
          fVar194 = auVar20._8_4_;
          auVar29._8_4_ = fVar194 * fVar117;
          fVar196 = auVar20._12_4_;
          auVar29._12_4_ = fVar196 * fVar119;
          fVar198 = auVar20._16_4_;
          auVar29._16_4_ = fVar198 * fVar121;
          fVar200 = auVar20._20_4_;
          auVar29._20_4_ = fVar200 * fVar123;
          fVar202 = auVar20._24_4_;
          auVar29._24_4_ = fVar202 * fVar139;
          auVar29._28_4_ = local_1680._28_4_ + fVar95;
          fVar113 = fVar6 + auVar70._0_4_;
          fVar115 = fVar8 + auVar70._4_4_;
          fVar117 = fVar10 + auVar70._8_4_;
          fVar119 = fVar76 + auVar70._12_4_;
          fVar121 = fVar78 + auVar70._16_4_;
          fVar123 = fVar80 + auVar70._20_4_;
          fVar139 = fVar13 + auVar70._24_4_;
          auVar30._4_4_ = fVar176 * fVar115;
          auVar30._0_4_ = fVar172 * fVar113;
          auVar30._8_4_ = fVar178 * fVar117;
          auVar30._12_4_ = fVar180 * fVar119;
          auVar30._16_4_ = fVar182 * fVar121;
          auVar30._20_4_ = fVar184 * fVar123;
          auVar30._24_4_ = fVar186 * fVar139;
          auVar30._28_4_ = local_1440._28_4_;
          auVar20 = vsubps_avx(auVar30,auVar29);
          auVar31._4_4_ = fVar160 * fVar115;
          auVar31._0_4_ = fVar156 * fVar113;
          auVar31._8_4_ = fVar162 * fVar117;
          auVar31._12_4_ = fVar163 * fVar119;
          auVar31._16_4_ = fVar164 * fVar121;
          auVar31._20_4_ = fVar165 * fVar123;
          auVar31._24_4_ = fVar166 * fVar139;
          auVar31._28_4_ = local_1640._28_4_ + auVar70._28_4_;
          auVar32._4_4_ = fVar192 * fVar101;
          auVar32._0_4_ = fVar190 * fVar100;
          auVar32._8_4_ = fVar194 * fVar102;
          auVar32._12_4_ = fVar196 * fVar103;
          auVar32._16_4_ = fVar198 * fVar104;
          auVar32._20_4_ = fVar200 * fVar105;
          auVar32._24_4_ = fVar202 * fVar106;
          auVar32._28_4_ = fVar92 + auVar74._28_4_;
          auVar21 = vsubps_avx(auVar32,auVar31);
          local_1460._0_4_ =
               local_17a0._4_4_ * auVar19._0_4_ +
               local_1700._4_4_ * auVar20._0_4_ + local_1720._4_4_ * auVar21._0_4_;
          local_1460._4_4_ =
               local_17a0._4_4_ * auVar19._4_4_ +
               local_1700._4_4_ * auVar20._4_4_ + local_1720._4_4_ * auVar21._4_4_;
          local_1460._8_4_ =
               local_17a0._4_4_ * auVar19._8_4_ +
               local_1700._4_4_ * auVar20._8_4_ + local_1720._4_4_ * auVar21._8_4_;
          local_1460._12_4_ =
               local_17a0._4_4_ * auVar19._12_4_ +
               local_1700._4_4_ * auVar20._12_4_ + local_1720._4_4_ * auVar21._12_4_;
          local_1460._16_4_ =
               local_17a0._4_4_ * auVar19._16_4_ +
               local_1700._4_4_ * auVar20._16_4_ + local_1720._4_4_ * auVar21._16_4_;
          local_1460._20_4_ =
               local_17a0._4_4_ * auVar19._20_4_ +
               local_1700._4_4_ * auVar20._20_4_ + local_1720._4_4_ * auVar21._20_4_;
          local_1460._24_4_ =
               local_17a0._4_4_ * auVar19._24_4_ +
               local_1700._4_4_ * auVar20._24_4_ + local_1720._4_4_ * auVar21._24_4_;
          local_1460._28_4_ = auVar19._28_4_ + auVar20._28_4_ + auVar21._28_4_;
          auVar19 = vsubps_avx(auVar70,auVar16);
          fVar113 = auVar16._0_4_ + auVar70._0_4_;
          fVar115 = auVar16._4_4_ + auVar70._4_4_;
          fVar117 = auVar16._8_4_ + auVar70._8_4_;
          fVar119 = auVar16._12_4_ + auVar70._12_4_;
          fVar121 = auVar16._16_4_ + auVar70._16_4_;
          fVar123 = auVar16._20_4_ + auVar70._20_4_;
          fVar139 = auVar16._24_4_ + auVar70._24_4_;
          fVar144 = auVar16._28_4_ + auVar70._28_4_;
          auVar70 = vsubps_avx(auVar74,auVar17);
          fVar100 = auVar74._0_4_ + auVar17._0_4_;
          fVar101 = auVar74._4_4_ + auVar17._4_4_;
          fVar102 = auVar74._8_4_ + auVar17._8_4_;
          fVar103 = auVar74._12_4_ + auVar17._12_4_;
          fVar104 = auVar74._16_4_ + auVar17._16_4_;
          fVar105 = auVar74._20_4_ + auVar17._20_4_;
          fVar106 = auVar74._24_4_ + auVar17._24_4_;
          auVar16 = vsubps_avx(auVar15,auVar18);
          fVar146 = auVar15._0_4_ + auVar18._0_4_;
          fVar148 = auVar15._4_4_ + auVar18._4_4_;
          fVar150 = auVar15._8_4_ + auVar18._8_4_;
          fVar152 = auVar15._12_4_ + auVar18._12_4_;
          fVar154 = auVar15._16_4_ + auVar18._16_4_;
          fVar92 = auVar15._20_4_ + auVar18._20_4_;
          fVar94 = auVar15._24_4_ + auVar18._24_4_;
          fVar107 = auVar16._0_4_;
          fVar114 = auVar16._4_4_;
          auVar33._4_4_ = fVar114 * fVar101;
          auVar33._0_4_ = fVar107 * fVar100;
          fVar116 = auVar16._8_4_;
          auVar33._8_4_ = fVar116 * fVar102;
          fVar118 = auVar16._12_4_;
          auVar33._12_4_ = fVar118 * fVar103;
          fVar120 = auVar16._16_4_;
          auVar33._16_4_ = fVar120 * fVar104;
          fVar122 = auVar16._20_4_;
          auVar33._20_4_ = fVar122 * fVar105;
          fVar124 = auVar16._24_4_;
          auVar33._24_4_ = fVar124 * fVar106;
          auVar33._28_4_ = local_1440._28_4_;
          fVar140 = auVar70._0_4_;
          fVar145 = auVar70._4_4_;
          auVar34._4_4_ = fVar145 * fVar148;
          auVar34._0_4_ = fVar140 * fVar146;
          fVar147 = auVar70._8_4_;
          auVar34._8_4_ = fVar147 * fVar150;
          fVar149 = auVar70._12_4_;
          auVar34._12_4_ = fVar149 * fVar152;
          fVar151 = auVar70._16_4_;
          auVar34._16_4_ = fVar151 * fVar154;
          fVar153 = auVar70._20_4_;
          auVar34._20_4_ = fVar153 * fVar92;
          fVar155 = auVar70._24_4_;
          uVar3 = auVar70._28_4_;
          auVar34._24_4_ = fVar155 * fVar94;
          auVar34._28_4_ = uVar3;
          auVar20 = vsubps_avx(auVar34,auVar33);
          fVar157 = auVar19._0_4_;
          fVar161 = auVar19._4_4_;
          auVar35._4_4_ = fVar161 * fVar148;
          auVar35._0_4_ = fVar157 * fVar146;
          fVar146 = auVar19._8_4_;
          auVar35._8_4_ = fVar146 * fVar150;
          fVar148 = auVar19._12_4_;
          auVar35._12_4_ = fVar148 * fVar152;
          fVar150 = auVar19._16_4_;
          auVar35._16_4_ = fVar150 * fVar154;
          fVar152 = auVar19._20_4_;
          auVar35._20_4_ = fVar152 * fVar92;
          fVar154 = auVar19._24_4_;
          auVar35._24_4_ = fVar154 * fVar94;
          auVar35._28_4_ = fVar95 + auVar18._28_4_;
          auVar36._4_4_ = fVar114 * fVar115;
          auVar36._0_4_ = fVar107 * fVar113;
          auVar36._8_4_ = fVar116 * fVar117;
          auVar36._12_4_ = fVar118 * fVar119;
          auVar36._16_4_ = fVar120 * fVar121;
          auVar36._20_4_ = fVar122 * fVar123;
          auVar36._24_4_ = fVar124 * fVar139;
          auVar36._28_4_ = uVar3;
          auVar70 = vsubps_avx(auVar36,auVar35);
          auVar37._4_4_ = fVar145 * fVar115;
          auVar37._0_4_ = fVar140 * fVar113;
          auVar37._8_4_ = fVar147 * fVar117;
          auVar37._12_4_ = fVar149 * fVar119;
          auVar37._16_4_ = fVar151 * fVar121;
          auVar37._20_4_ = fVar153 * fVar123;
          auVar37._24_4_ = fVar155 * fVar139;
          auVar37._28_4_ = fVar144;
          auVar38._4_4_ = fVar161 * fVar101;
          auVar38._0_4_ = fVar157 * fVar100;
          auVar38._8_4_ = fVar146 * fVar102;
          auVar38._12_4_ = fVar148 * fVar103;
          auVar38._16_4_ = fVar150 * fVar104;
          auVar38._20_4_ = fVar152 * fVar105;
          auVar38._24_4_ = fVar154 * fVar106;
          auVar38._28_4_ = auVar74._28_4_ + auVar17._28_4_;
          auVar74 = vsubps_avx(auVar38,auVar37);
          local_1720._0_4_ = local_1720._4_4_;
          fStack_1718 = local_1720._4_4_;
          fStack_1714 = local_1720._4_4_;
          fStack_1710 = local_1720._4_4_;
          fStack_170c = local_1720._4_4_;
          fStack_1708 = local_1720._4_4_;
          fStack_1704 = local_1720._4_4_;
          local_1700._0_4_ = local_1700._4_4_;
          fStack_16f8 = local_1700._4_4_;
          fStack_16f4 = local_1700._4_4_;
          fStack_16f0 = local_1700._4_4_;
          fStack_16ec = local_1700._4_4_;
          fStack_16e8 = local_1700._4_4_;
          fStack_16e4 = local_1700._4_4_;
          local_17a0._0_4_ = local_17a0._4_4_;
          fStack_1798 = local_17a0._4_4_;
          fStack_1794 = local_17a0._4_4_;
          fStack_1790 = local_17a0._4_4_;
          fStack_178c = local_17a0._4_4_;
          fStack_1788 = local_17a0._4_4_;
          fStack_1784 = local_17a0._4_4_;
          auVar73._0_4_ =
               auVar20._0_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._0_4_ + local_1720._4_4_ * auVar74._0_4_;
          auVar73._4_4_ =
               auVar20._4_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._4_4_ + local_1720._4_4_ * auVar74._4_4_;
          auVar73._8_4_ =
               auVar20._8_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._8_4_ + local_1720._4_4_ * auVar74._8_4_;
          auVar73._12_4_ =
               auVar20._12_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._12_4_ + local_1720._4_4_ * auVar74._12_4_;
          auVar73._16_4_ =
               auVar20._16_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._16_4_ + local_1720._4_4_ * auVar74._16_4_;
          auVar73._20_4_ =
               auVar20._20_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._20_4_ + local_1720._4_4_ * auVar74._20_4_;
          auVar73._24_4_ =
               auVar20._24_4_ * local_17a0._4_4_ +
               local_1700._4_4_ * auVar70._24_4_ + local_1720._4_4_ * auVar74._24_4_;
          auVar73._28_4_ = fVar144 + fVar144 + auVar74._28_4_;
          local_17e0._0_4_ = auVar73._0_4_ + local_17c0._0_4_ + local_1460._0_4_;
          local_17e0._4_4_ = auVar73._4_4_ + local_17c0._4_4_ + local_1460._4_4_;
          local_17e0._8_4_ = auVar73._8_4_ + local_17c0._8_4_ + local_1460._8_4_;
          local_17e0._12_4_ = auVar73._12_4_ + local_17c0._12_4_ + local_1460._12_4_;
          local_17e0._16_4_ = auVar73._16_4_ + local_17c0._16_4_ + local_1460._16_4_;
          local_17e0._20_4_ = auVar73._20_4_ + local_17c0._20_4_ + local_1460._20_4_;
          local_17e0._24_4_ = auVar73._24_4_ + local_17c0._24_4_ + local_1460._24_4_;
          local_17e0._28_4_ = auVar73._28_4_ + local_17c0._28_4_ + local_1460._28_4_;
          auVar70 = vminps_avx(local_17c0,local_1460);
          auVar70 = vminps_avx(auVar70,auVar73);
          auVar127._8_4_ = 0x7fffffff;
          auVar127._0_8_ = 0x7fffffff7fffffff;
          auVar127._12_4_ = 0x7fffffff;
          auVar127._16_4_ = 0x7fffffff;
          auVar127._20_4_ = 0x7fffffff;
          auVar127._24_4_ = 0x7fffffff;
          auVar127._28_4_ = 0x7fffffff;
          local_1480 = vandps_avx(local_17e0,auVar127);
          fVar95 = local_1480._0_4_ * 1.1920929e-07;
          fVar100 = local_1480._4_4_ * 1.1920929e-07;
          auVar39._4_4_ = fVar100;
          auVar39._0_4_ = fVar95;
          fVar101 = local_1480._8_4_ * 1.1920929e-07;
          auVar39._8_4_ = fVar101;
          fVar102 = local_1480._12_4_ * 1.1920929e-07;
          auVar39._12_4_ = fVar102;
          fVar103 = local_1480._16_4_ * 1.1920929e-07;
          auVar39._16_4_ = fVar103;
          fVar104 = local_1480._20_4_ * 1.1920929e-07;
          auVar39._20_4_ = fVar104;
          fVar105 = local_1480._24_4_ * 1.1920929e-07;
          auVar39._24_4_ = fVar105;
          auVar39._28_4_ = 0x34000000;
          auVar142._0_8_ = CONCAT44(fVar100,fVar95) ^ 0x8000000080000000;
          auVar142._8_4_ = -fVar101;
          auVar142._12_4_ = -fVar102;
          auVar142._16_4_ = -fVar103;
          auVar142._20_4_ = -fVar104;
          auVar142._24_4_ = -fVar105;
          auVar142._28_4_ = 0xb4000000;
          auVar70 = vcmpps_avx(auVar70,auVar142,5);
          auVar15 = vmaxps_avx(local_17c0,local_1460);
          auVar74 = vmaxps_avx(auVar15,auVar73);
          auVar74 = vcmpps_avx(auVar74,auVar39,2);
          auVar74 = vorps_avx(auVar70,auVar74);
          if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar74 >> 0x7f,0) == '\0') &&
                (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar74 >> 0xbf,0) == '\0') &&
              (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar74[0x1f]) {
LAB_00e69db8:
            auVar138 = ZEXT3264(local_14e0);
            auVar143 = ZEXT3264(local_1500);
            auVar159 = ZEXT3264(local_1520);
            auVar168 = ZEXT3264(local_1540);
            auVar170 = ZEXT3264(local_1560);
            auVar174 = ZEXT3264(local_1580);
            auVar188 = ZEXT3264(local_15a0);
            auVar99 = ZEXT3264(local_15c0);
            auVar86 = ZEXT3264(local_15e0);
            auVar112 = ZEXT3264(local_1600);
            auVar130 = ZEXT3264(local_1620);
          }
          else {
            auVar40._4_4_ = fVar160 * fVar131;
            auVar40._0_4_ = fVar156 * fVar125;
            auVar40._8_4_ = fVar162 * fVar132;
            auVar40._12_4_ = fVar163 * fVar133;
            auVar40._16_4_ = fVar164 * fVar134;
            auVar40._20_4_ = fVar165 * fVar135;
            auVar40._24_4_ = fVar166 * fVar136;
            auVar40._28_4_ = auVar70._28_4_;
            auVar41._4_4_ = fVar175 * fVar176;
            auVar41._0_4_ = fVar171 * fVar172;
            auVar41._8_4_ = fVar177 * fVar178;
            auVar41._12_4_ = fVar179 * fVar180;
            auVar41._16_4_ = fVar181 * fVar182;
            auVar41._20_4_ = fVar183 * fVar184;
            auVar41._24_4_ = fVar185 * fVar186;
            auVar41._28_4_ = 0x34000000;
            auVar17 = vsubps_avx(auVar41,auVar40);
            auVar42._4_4_ = fVar176 * fVar145;
            auVar42._0_4_ = fVar172 * fVar140;
            auVar42._8_4_ = fVar178 * fVar147;
            auVar42._12_4_ = fVar180 * fVar149;
            auVar42._16_4_ = fVar182 * fVar151;
            auVar42._20_4_ = fVar184 * fVar153;
            auVar42._24_4_ = fVar186 * fVar155;
            auVar42._28_4_ = auVar15._28_4_;
            auVar43._4_4_ = fVar160 * fVar114;
            auVar43._0_4_ = fVar156 * fVar107;
            auVar43._8_4_ = fVar162 * fVar116;
            auVar43._12_4_ = fVar163 * fVar118;
            auVar43._16_4_ = fVar164 * fVar120;
            auVar43._20_4_ = fVar165 * fVar122;
            auVar43._24_4_ = fVar166 * fVar124;
            auVar43._28_4_ = auVar20._28_4_;
            auVar18 = vsubps_avx(auVar43,auVar42);
            auVar98._8_4_ = 0x7fffffff;
            auVar98._0_8_ = 0x7fffffff7fffffff;
            auVar98._12_4_ = 0x7fffffff;
            auVar98._16_4_ = 0x7fffffff;
            auVar98._20_4_ = 0x7fffffff;
            auVar98._24_4_ = 0x7fffffff;
            auVar98._28_4_ = 0x7fffffff;
            auVar70 = vandps_avx(auVar40,auVar98);
            auVar15 = vandps_avx(auVar42,auVar98);
            auVar70 = vcmpps_avx(auVar70,auVar15,1);
            local_1360 = vblendvps_avx(auVar18,auVar17,auVar70);
            auVar44._4_4_ = fVar192 * fVar114;
            auVar44._0_4_ = fVar190 * fVar107;
            auVar44._8_4_ = fVar194 * fVar116;
            auVar44._12_4_ = fVar196 * fVar118;
            auVar44._16_4_ = fVar198 * fVar120;
            auVar44._20_4_ = fVar200 * fVar122;
            auVar44._24_4_ = fVar202 * fVar124;
            auVar44._28_4_ = auVar70._28_4_;
            auVar45._4_4_ = fVar192 * fVar131;
            auVar45._0_4_ = fVar190 * fVar125;
            auVar45._8_4_ = fVar194 * fVar132;
            auVar45._12_4_ = fVar196 * fVar133;
            auVar45._16_4_ = fVar198 * fVar134;
            auVar45._20_4_ = fVar200 * fVar135;
            auVar45._24_4_ = fVar202 * fVar136;
            auVar45._28_4_ = auVar17._28_4_;
            auVar46._4_4_ = fVar87 * fVar176;
            auVar46._0_4_ = fVar81 * fVar172;
            auVar46._8_4_ = fVar88 * fVar178;
            auVar46._12_4_ = fVar89 * fVar180;
            auVar46._16_4_ = fVar90 * fVar182;
            auVar46._20_4_ = fVar91 * fVar184;
            auVar46._24_4_ = fVar93 * fVar186;
            auVar46._28_4_ = local_16e0._28_4_;
            auVar17 = vsubps_avx(auVar45,auVar46);
            auVar47._4_4_ = fVar176 * fVar161;
            auVar47._0_4_ = fVar172 * fVar157;
            auVar47._8_4_ = fVar178 * fVar146;
            auVar47._12_4_ = fVar180 * fVar148;
            auVar47._16_4_ = fVar182 * fVar150;
            auVar47._20_4_ = fVar184 * fVar152;
            auVar47._24_4_ = fVar186 * fVar154;
            auVar47._28_4_ = auVar15._28_4_;
            auVar18 = vsubps_avx(auVar47,auVar44);
            auVar70 = vandps_avx(auVar46,auVar98);
            auVar15 = vandps_avx(auVar44,auVar98);
            auVar70 = vcmpps_avx(auVar70,auVar15,1);
            local_1340 = vblendvps_avx(auVar18,auVar17,auVar70);
            auVar48._4_4_ = fVar160 * fVar161;
            auVar48._0_4_ = fVar156 * fVar157;
            auVar48._8_4_ = fVar162 * fVar146;
            auVar48._12_4_ = fVar163 * fVar148;
            auVar48._16_4_ = fVar164 * fVar150;
            auVar48._20_4_ = fVar165 * fVar152;
            auVar48._24_4_ = fVar166 * fVar154;
            auVar48._28_4_ = auVar70._28_4_;
            auVar137._8_4_ = 0x3f800000;
            auVar137._0_8_ = 0x3f8000003f800000;
            auVar137._12_4_ = 0x3f800000;
            auVar137._16_4_ = 0x3f800000;
            auVar137._20_4_ = 0x3f800000;
            auVar137._24_4_ = 0x3f800000;
            auVar137._28_4_ = 0x3f800000;
            auVar49._4_4_ = fVar87 * fVar160;
            auVar49._0_4_ = fVar81 * fVar156;
            auVar49._8_4_ = fVar88 * fVar162;
            auVar49._12_4_ = fVar89 * fVar163;
            auVar49._16_4_ = fVar90 * fVar164;
            auVar49._20_4_ = fVar91 * fVar165;
            auVar49._24_4_ = fVar93 * fVar166;
            auVar49._28_4_ = auVar17._28_4_;
            auVar50._4_4_ = fVar175 * fVar192;
            auVar50._0_4_ = fVar171 * fVar190;
            auVar50._8_4_ = fVar177 * fVar194;
            auVar50._12_4_ = fVar179 * fVar196;
            auVar50._16_4_ = fVar181 * fVar198;
            auVar50._20_4_ = fVar183 * fVar200;
            auVar50._24_4_ = fVar185 * fVar202;
            auVar50._28_4_ = auVar16._28_4_;
            auVar51._4_4_ = fVar192 * fVar145;
            auVar51._0_4_ = fVar190 * fVar140;
            auVar51._8_4_ = fVar194 * fVar147;
            auVar51._12_4_ = fVar196 * fVar149;
            auVar51._16_4_ = fVar198 * fVar151;
            auVar51._20_4_ = fVar200 * fVar153;
            auVar51._24_4_ = fVar202 * fVar155;
            auVar51._28_4_ = uVar3;
            auVar16 = vsubps_avx(auVar49,auVar50);
            auVar17 = vsubps_avx(auVar51,auVar48);
            auVar70 = vandps_avx(auVar50,auVar98);
            auVar15 = vandps_avx(auVar48,auVar98);
            auVar15 = vcmpps_avx(auVar70,auVar15,1);
            local_1320 = vblendvps_avx(auVar17,auVar16,auVar15);
            auVar69 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
            fVar100 = local_1320._0_4_;
            fVar101 = local_1320._4_4_;
            fVar102 = local_1320._8_4_;
            fVar103 = local_1320._12_4_;
            fVar104 = local_1320._16_4_;
            fVar105 = local_1320._20_4_;
            fVar106 = local_1320._24_4_;
            fVar144 = local_1340._0_4_;
            fVar81 = local_1340._4_4_;
            fVar146 = local_1340._8_4_;
            fVar87 = local_1340._12_4_;
            fVar148 = local_1340._16_4_;
            fVar88 = local_1340._20_4_;
            fVar150 = local_1340._24_4_;
            fVar89 = local_1360._0_4_;
            fVar152 = local_1360._4_4_;
            fVar90 = local_1360._8_4_;
            fVar154 = local_1360._12_4_;
            fVar91 = local_1360._16_4_;
            fVar92 = local_1360._20_4_;
            fVar93 = local_1360._24_4_;
            fVar95 = fVar89 * local_17a0._4_4_ +
                     fVar144 * local_1700._4_4_ + fVar100 * local_1720._4_4_;
            fVar113 = fVar152 * local_17a0._4_4_ +
                      fVar81 * local_1700._4_4_ + fVar101 * local_1720._4_4_;
            fVar115 = fVar90 * local_17a0._4_4_ +
                      fVar146 * local_1700._4_4_ + fVar102 * local_1720._4_4_;
            fVar117 = fVar154 * local_17a0._4_4_ +
                      fVar87 * local_1700._4_4_ + fVar103 * local_1720._4_4_;
            fVar119 = fVar91 * local_17a0._4_4_ +
                      fVar148 * local_1700._4_4_ + fVar104 * local_1720._4_4_;
            fVar121 = fVar92 * local_17a0._4_4_ +
                      fVar88 * local_1700._4_4_ + fVar105 * local_1720._4_4_;
            fVar123 = fVar93 * local_17a0._4_4_ +
                      fVar150 * local_1700._4_4_ + fVar106 * local_1720._4_4_;
            fVar139 = auVar16._28_4_ + auVar16._28_4_ + 0.0;
            auVar84._0_4_ = fVar95 + fVar95;
            auVar84._4_4_ = fVar113 + fVar113;
            auVar84._8_4_ = fVar115 + fVar115;
            auVar84._12_4_ = fVar117 + fVar117;
            auVar84._16_4_ = fVar119 + fVar119;
            auVar84._20_4_ = fVar121 + fVar121;
            auVar84._24_4_ = fVar123 + fVar123;
            auVar84._28_4_ = fVar139 + fVar139;
            fVar95 = auVar70._28_4_;
            auVar70 = vrcpps_avx(auVar84);
            fVar113 = fVar89 * fVar6 + fVar144 * fVar189 + fVar100 * fVar2;
            fVar115 = fVar152 * fVar8 + fVar81 * fVar191 + fVar101 * fVar7;
            fVar117 = fVar90 * fVar10 + fVar146 * fVar193 + fVar102 * fVar9;
            fVar76 = fVar154 * fVar76 + fVar87 * fVar195 + fVar103 * fVar11;
            fVar77 = fVar91 * fVar78 + fVar148 * fVar197 + fVar104 * fVar77;
            fVar78 = fVar92 * fVar80 + fVar88 * fVar199 + fVar105 * fVar79;
            fVar79 = fVar93 * fVar13 + fVar150 * fVar201 + fVar106 * fVar12;
            fVar80 = fVar95 + fVar95 + fVar139;
            fVar2 = auVar70._0_4_;
            fVar6 = auVar70._4_4_;
            auVar52._4_4_ = auVar84._4_4_ * fVar6;
            auVar52._0_4_ = auVar84._0_4_ * fVar2;
            fVar7 = auVar70._8_4_;
            auVar52._8_4_ = auVar84._8_4_ * fVar7;
            fVar8 = auVar70._12_4_;
            auVar52._12_4_ = auVar84._12_4_ * fVar8;
            fVar9 = auVar70._16_4_;
            auVar52._16_4_ = auVar84._16_4_ * fVar9;
            fVar10 = auVar70._20_4_;
            auVar52._20_4_ = auVar84._20_4_ * fVar10;
            fVar11 = auVar70._24_4_;
            auVar52._24_4_ = auVar84._24_4_ * fVar11;
            auVar52._28_4_ = fVar95;
            auVar70 = vsubps_avx(auVar137,auVar52);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar128._4_4_ = uVar3;
            auVar128._0_4_ = uVar3;
            auVar128._8_4_ = uVar3;
            auVar128._12_4_ = uVar3;
            auVar128._16_4_ = uVar3;
            auVar128._20_4_ = uVar3;
            auVar128._24_4_ = uVar3;
            auVar128._28_4_ = uVar3;
            local_12a0._4_4_ = (fVar115 + fVar115) * (fVar6 + fVar6 * auVar70._4_4_);
            local_12a0._0_4_ = (fVar113 + fVar113) * (fVar2 + fVar2 * auVar70._0_4_);
            local_12a0._8_4_ = (fVar117 + fVar117) * (fVar7 + fVar7 * auVar70._8_4_);
            local_12a0._12_4_ = (fVar76 + fVar76) * (fVar8 + fVar8 * auVar70._12_4_);
            local_12a0._16_4_ = (fVar77 + fVar77) * (fVar9 + fVar9 * auVar70._16_4_);
            local_12a0._20_4_ = (fVar78 + fVar78) * (fVar10 + fVar10 * auVar70._20_4_);
            local_12a0._24_4_ = (fVar79 + fVar79) * (fVar11 + fVar11 * auVar70._24_4_);
            local_12a0._28_4_ = fVar80 + fVar80;
            auVar70 = vcmpps_avx(auVar128,local_12a0,2);
            fVar2 = ray->tfar;
            auVar129._4_4_ = fVar2;
            auVar129._0_4_ = fVar2;
            auVar129._8_4_ = fVar2;
            auVar129._12_4_ = fVar2;
            auVar129._16_4_ = fVar2;
            auVar129._20_4_ = fVar2;
            auVar129._24_4_ = fVar2;
            auVar129._28_4_ = fVar2;
            auVar74 = vcmpps_avx(local_12a0,auVar129,2);
            auVar70 = vandps_avx(auVar74,auVar70);
            auVar74 = vcmpps_avx(auVar84,_DAT_01f7b000,4);
            auVar70 = vandps_avx(auVar70,auVar74);
            auVar108 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
            auVar69 = vpand_avx(auVar108,auVar69);
            auVar108 = vpmovsxwd_avx(auVar69);
            auVar14 = vpshufd_avx(auVar69,0xee);
            auVar14 = vpmovsxwd_avx(auVar14);
            local_1300._16_16_ = auVar14;
            local_1300._0_16_ = auVar108;
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar14 >> 0x3f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar14[0xf]) goto LAB_00e69db8;
            local_1640._0_8_ = lVar61;
            local_13c0 = local_17c0._0_4_;
            fStack_13bc = local_17c0._4_4_;
            fStack_13b8 = local_17c0._8_4_;
            fStack_13b4 = local_17c0._12_4_;
            fStack_13b0 = local_17c0._16_4_;
            fStack_13ac = local_17c0._20_4_;
            fStack_13a8 = local_17c0._24_4_;
            fStack_13a4 = local_17c0._28_4_;
            local_13a0 = local_1460._0_4_;
            fStack_139c = local_1460._4_4_;
            fStack_1398 = local_1460._8_4_;
            fStack_1394 = local_1460._12_4_;
            fStack_1390 = local_1460._16_4_;
            fStack_138c = local_1460._20_4_;
            fStack_1388 = local_1460._24_4_;
            fStack_1384 = local_1460._28_4_;
            local_1380 = local_17e0;
            local_1220 = local_14a0;
            auVar70 = vrcpps_avx(local_17e0);
            fVar2 = auVar70._0_4_;
            fVar6 = auVar70._4_4_;
            auVar53._4_4_ = local_17e0._4_4_ * fVar6;
            auVar53._0_4_ = local_17e0._0_4_ * fVar2;
            fVar7 = auVar70._8_4_;
            auVar53._8_4_ = local_17e0._8_4_ * fVar7;
            fVar8 = auVar70._12_4_;
            auVar53._12_4_ = local_17e0._12_4_ * fVar8;
            fVar9 = auVar70._16_4_;
            auVar53._16_4_ = local_17e0._16_4_ * fVar9;
            fVar10 = auVar70._20_4_;
            auVar53._20_4_ = local_17e0._20_4_ * fVar10;
            fVar11 = auVar70._24_4_;
            auVar53._24_4_ = local_17e0._24_4_ * fVar11;
            auVar53._28_4_ = auVar14._12_4_;
            auVar74 = vsubps_avx(auVar137,auVar53);
            auVar75._0_4_ = fVar2 + fVar2 * auVar74._0_4_;
            auVar75._4_4_ = fVar6 + fVar6 * auVar74._4_4_;
            auVar75._8_4_ = fVar7 + fVar7 * auVar74._8_4_;
            auVar75._12_4_ = fVar8 + fVar8 * auVar74._12_4_;
            auVar75._16_4_ = fVar9 + fVar9 * auVar74._16_4_;
            auVar75._20_4_ = fVar10 + fVar10 * auVar74._20_4_;
            auVar75._24_4_ = fVar11 + fVar11 * auVar74._24_4_;
            auVar75._28_4_ = auVar70._28_4_ + auVar74._28_4_;
            auVar85._8_4_ = 0x219392ef;
            auVar85._0_8_ = 0x219392ef219392ef;
            auVar85._12_4_ = 0x219392ef;
            auVar85._16_4_ = 0x219392ef;
            auVar85._20_4_ = 0x219392ef;
            auVar85._24_4_ = 0x219392ef;
            auVar85._28_4_ = 0x219392ef;
            auVar74 = vcmpps_avx(local_1480,auVar85,5);
            auVar70 = vandps_avx(auVar74,auVar75);
            auVar54._4_4_ = local_17c0._4_4_ * auVar70._4_4_;
            auVar54._0_4_ = local_17c0._0_4_ * auVar70._0_4_;
            auVar54._8_4_ = local_17c0._8_4_ * auVar70._8_4_;
            auVar54._12_4_ = local_17c0._12_4_ * auVar70._12_4_;
            auVar54._16_4_ = local_17c0._16_4_ * auVar70._16_4_;
            auVar54._20_4_ = local_17c0._20_4_ * auVar70._20_4_;
            auVar54._24_4_ = local_17c0._24_4_ * auVar70._24_4_;
            auVar54._28_4_ = auVar74._28_4_;
            auVar74 = vminps_avx(auVar54,auVar137);
            auVar55._4_4_ = local_1460._4_4_ * auVar70._4_4_;
            auVar55._0_4_ = local_1460._0_4_ * auVar70._0_4_;
            auVar55._8_4_ = local_1460._8_4_ * auVar70._8_4_;
            auVar55._12_4_ = local_1460._12_4_ * auVar70._12_4_;
            auVar55._16_4_ = local_1460._16_4_ * auVar70._16_4_;
            auVar55._20_4_ = local_1460._20_4_ * auVar70._20_4_;
            auVar55._24_4_ = local_1460._24_4_ * auVar70._24_4_;
            auVar55._28_4_ = auVar70._28_4_;
            auVar70 = vminps_avx(auVar55,auVar137);
            auVar15 = vsubps_avx(auVar137,auVar74);
            auVar16 = vsubps_avx(auVar137,auVar70);
            local_12c0 = vblendvps_avx(auVar70,auVar15,local_14a0);
            local_12e0 = vblendvps_avx(auVar74,auVar16,local_14a0);
            local_1280._4_4_ = fVar152 * (float)local_14c0._4_4_;
            local_1280._0_4_ = fVar89 * (float)local_14c0._0_4_;
            local_1280._8_4_ = fVar90 * fStack_14b8;
            local_1280._12_4_ = fVar154 * fStack_14b4;
            local_1280._16_4_ = fVar91 * fStack_14b0;
            local_1280._20_4_ = fVar92 * fStack_14ac;
            local_1280._24_4_ = fVar93 * fStack_14a8;
            local_1280._28_4_ = local_12c0._28_4_;
            local_1260[0] = fVar144 * (float)local_14c0._0_4_;
            local_1260[1] = fVar81 * (float)local_14c0._4_4_;
            local_1260[2] = fVar146 * fStack_14b8;
            local_1260[3] = fVar87 * fStack_14b4;
            fStack_1250 = fVar148 * fStack_14b0;
            fStack_124c = fVar88 * fStack_14ac;
            fStack_1248 = fVar150 * fStack_14a8;
            uStack_1244 = local_12e0._28_4_;
            local_1240[0] = (float)local_14c0._0_4_ * fVar100;
            local_1240[1] = (float)local_14c0._4_4_ * fVar101;
            local_1240[2] = fStack_14b8 * fVar102;
            local_1240[3] = fStack_14b4 * fVar103;
            fStack_1230 = fStack_14b0 * fVar104;
            fStack_122c = fStack_14ac * fVar105;
            fStack_1228 = fStack_14a8 * fVar106;
            uStack_1224 = local_1320._28_4_;
            auVar69 = vpsllw_avx(auVar69,0xf);
            auVar69 = vpacksswb_avx(auVar69,auVar69);
            uVar57 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 | (SUB161(auVar69 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar69 >> 0x3f,0) << 7);
            auVar138 = ZEXT3264(local_14e0);
            auVar143 = ZEXT3264(local_1500);
            auVar159 = ZEXT3264(local_1520);
            auVar168 = ZEXT3264(local_1540);
            auVar170 = ZEXT3264(local_1560);
            auVar174 = ZEXT3264(local_1580);
            auVar188 = ZEXT3264(local_15a0);
            auVar99 = ZEXT3264(local_15c0);
            auVar86 = ZEXT3264(local_15e0);
            auVar112 = ZEXT3264(local_1600);
            auVar130 = ZEXT3264(local_1620);
            local_1700 = context->scene;
            pSVar60 = context->scene;
            local_16e0 = auVar22;
            do {
              uVar59 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              local_1768 = *(uint *)((long)&local_13e0 + uVar59 * 4);
              pGVar5 = (pSVar60->geometries).items[local_1768].ptr;
              if ((pGVar5->mask & ray->mask) == 0) {
                uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
              }
              else {
                local_17a0 = uVar59;
                local_1720 = uVar57;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e69e3a;
                local_17c0._0_8_ = context->args;
                local_16a0._0_8_ = uVar65;
                local_1680._0_8_ = uVar64;
                local_1660._0_8_ = puVar63;
                local_1750.context = context->user;
                local_1780 = *(undefined4 *)(local_1280 + uVar59 * 4);
                local_177c = local_1260[uVar59];
                local_1778 = local_1240[uVar59];
                local_1774 = *(undefined4 *)(local_12e0 + uVar59 * 4);
                local_1770 = *(undefined4 *)(local_12c0 + uVar59 * 4);
                local_176c = *(undefined4 *)((long)&local_1400 + uVar59 * 4);
                local_1764 = (local_1750.context)->instID[0];
                local_1760 = (local_1750.context)->instPrimID[0];
                local_16c0._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_12a0 + uVar59 * 4);
                local_17ec = -1;
                local_1750.valid = &local_17ec;
                local_1750.geometryUserPtr = pGVar5->userPtr;
                local_17e0._0_8_ = ray;
                local_1750.hit = (RTCHitN *)&local_1780;
                local_1750.N = 1;
                local_16e0._0_8_ = pGVar5;
                local_1750.ray = (RTCRayN *)ray;
                if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar5->occlusionFilterN)(&local_1750), *local_1750.valid != 0)) {
                  ray = (Ray *)local_17e0._0_8_;
                  if ((*(code **)(local_17c0._0_8_ + 0x10) == (code *)0x0) ||
                     (((*(byte *)local_17c0._0_8_ & 2) == 0 &&
                      ((*(byte *)(local_16e0._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e69e3a:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  (**(code **)(local_17c0._0_8_ + 0x10))(&local_1750);
                  ray = (Ray *)local_17e0._0_8_;
                  if (*local_1750.valid != 0) goto LAB_00e69e3a;
                }
                *(undefined4 *)(local_17e0._0_8_ + 0x20) = local_16c0._0_4_;
                uVar57 = local_1720 ^ 1L << (local_17a0 & 0x3f);
                auVar138 = ZEXT3264(local_14e0);
                auVar143 = ZEXT3264(local_1500);
                auVar159 = ZEXT3264(local_1520);
                auVar168 = ZEXT3264(local_1540);
                auVar170 = ZEXT3264(local_1560);
                auVar174 = ZEXT3264(local_1580);
                auVar188 = ZEXT3264(local_15a0);
                auVar99 = ZEXT3264(local_15c0);
                auVar86 = ZEXT3264(local_15e0);
                auVar112 = ZEXT3264(local_1600);
                auVar130 = ZEXT3264(local_1620);
                ray = (Ray *)local_17e0._0_8_;
                puVar63 = (ulong *)local_1660._0_8_;
                uVar64 = local_1680._0_8_;
                uVar65 = local_16a0._0_8_;
              }
              pSVar60 = local_1700;
            } while (uVar57 != 0);
            lVar61 = local_1640._0_8_;
          }
        }
        goto LAB_00e693d5;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }